

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O2

void __thiscall QMdiSubWindowPrivate::updateInternalWindowTitle(QMdiSubWindowPrivate *this)

{
  int iVar1;
  int iVar2;
  QWidget *this_00;
  qsizetype qVar3;
  Data *pDVar4;
  char16_t *pcVar5;
  bool bVar6;
  int ah;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_60;
  QArrayDataPointer<char16_t> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  bVar6 = QWidget::isWindowModified(this_00);
  if (bVar6) {
    QWidget::windowTitle((QString *)&local_48,this_00);
    pDVar4 = (this->windowTitle).d.d;
    pcVar5 = (this->windowTitle).d.ptr;
    (this->windowTitle).d.d = local_48.d;
    (this->windowTitle).d.ptr = local_48.ptr;
    qVar3 = (this->windowTitle).d.size;
    (this->windowTitle).d.size = local_48.size;
    local_48.d = pDVar4;
    local_48.ptr = pcVar5;
    local_48.size = qVar3;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    QString::replace((QLatin1String *)&this->windowTitle,(QLatin1String *)0x3,0x5ea6f4);
  }
  else {
    QWidget::windowTitle((QString *)&local_60,this_00);
    qt_setWindowTitle_helperHelper((QString *)&local_48,(QString *)&local_60,this_00);
    pDVar4 = (this->windowTitle).d.d;
    pcVar5 = (this->windowTitle).d.ptr;
    (this->windowTitle).d.d = local_48.d;
    (this->windowTitle).d.ptr = local_48.ptr;
    qVar3 = (this->windowTitle).d.size;
    (this->windowTitle).d.size = local_48.size;
    local_48.d = pDVar4;
    local_48.ptr = pcVar5;
    local_48.size = qVar3;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
  }
  iVar1 = (this_00->data->crect).x2.m_i;
  iVar2 = (this_00->data->crect).x1.m_i;
  ah = titleBarHeight(this);
  QWidget::update(this_00,0,0,(iVar1 - iVar2) + 1,ah);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMdiSubWindowPrivate::updateInternalWindowTitle()
{
    Q_Q(QMdiSubWindow);
    if (q->isWindowModified()) {
        windowTitle = q->windowTitle();
        windowTitle.replace("[*]"_L1, "*"_L1);
    } else {
        windowTitle = qt_setWindowTitle_helperHelper(q->windowTitle(), q);
    }
    q->update(0, 0, q->width(), titleBarHeight());
}